

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft.c
# Opt level: O0

void aom_fft1d_32_float(float *input,float *output,int stride)

{
  int in_EDX;
  float *in_RSI;
  float *in_RDI;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float w93 [2];
  float w92 [2];
  float w91 [2];
  float w89 [2];
  float w88 [2];
  float w87 [2];
  float w86;
  float w85;
  float w84 [2];
  float w82 [2];
  float w81;
  float w80;
  float w78;
  float w77;
  float w76;
  float w75;
  float w74;
  float w73;
  float w71;
  float w70;
  float w69;
  float w68;
  float w67;
  float w66;
  float w65 [2];
  float w63 [2];
  float w62;
  float w61;
  float w59;
  float w58;
  float w57;
  float w56;
  float w55;
  float w54;
  float w52;
  float w51;
  float w50;
  float w49;
  float w48;
  float w47;
  float w46 [2];
  float w45 [2];
  float w44 [2];
  float w42 [2];
  float w41 [2];
  float w40 [2];
  float w39;
  float w38;
  float w37 [2];
  float w35 [2];
  float w34;
  float w33;
  float w31;
  float w30;
  float w29;
  float w28;
  float w27;
  float w26;
  float w24;
  float w23;
  float w22;
  float w21;
  float w20;
  float w19;
  float w18 [2];
  float w16 [2];
  float w15;
  float w14;
  float w12;
  float w11;
  float w10;
  float w9;
  float w8;
  float w7;
  float w5;
  float w4;
  float w3;
  float w2;
  float w1;
  float w0;
  float i31;
  float i30;
  float i29;
  float i28;
  float i27;
  float i26;
  float i25;
  float i24;
  float i23;
  float i22;
  float i21;
  float i20;
  float i19;
  float i18;
  float i17;
  float i16;
  float i15;
  float i14;
  float i13;
  float i12;
  float i11;
  float i10;
  float i9;
  float i8;
  float i7;
  float i6;
  float i5;
  float i4;
  float i3;
  float i2;
  float i1;
  float i0;
  float kWeight8;
  float kWeight7;
  float kWeight6;
  float kWeight5;
  float kWeight4;
  float kWeight3;
  float kWeight2;
  float kWeight0;
  
  fVar2 = *in_RDI;
  fVar25 = in_RDI[in_EDX];
  fVar12 = in_RDI[in_EDX << 1];
  fVar32 = in_RDI[in_EDX * 3];
  fVar6 = in_RDI[in_EDX << 2];
  fVar28 = in_RDI[in_EDX * 5];
  fVar15 = in_RDI[in_EDX * 6];
  fVar35 = in_RDI[in_EDX * 7];
  fVar4 = in_RDI[in_EDX << 3];
  fVar27 = in_RDI[in_EDX * 9];
  fVar13 = in_RDI[in_EDX * 10];
  fVar33 = in_RDI[in_EDX * 0xb];
  fVar8 = in_RDI[in_EDX * 0xc];
  fVar30 = in_RDI[in_EDX * 0xd];
  fVar17 = in_RDI[in_EDX * 0xe];
  fVar37 = in_RDI[in_EDX * 0xf];
  fVar3 = in_RDI[in_EDX << 4];
  fVar26 = in_RDI[in_EDX * 0x11];
  fVar14 = in_RDI[in_EDX * 0x12];
  fVar34 = in_RDI[in_EDX * 0x13];
  fVar7 = in_RDI[in_EDX * 0x14];
  fVar29 = in_RDI[in_EDX * 0x15];
  fVar16 = in_RDI[in_EDX * 0x16];
  fVar36 = in_RDI[in_EDX * 0x17];
  fVar5 = in_RDI[in_EDX * 0x18];
  fVar31 = in_RDI[in_EDX * 0x19];
  fVar18 = in_RDI[in_EDX * 0x1a];
  fVar38 = in_RDI[in_EDX * 0x1b];
  fVar9 = in_RDI[in_EDX * 0x1c];
  fVar39 = in_RDI[in_EDX * 0x1d];
  fVar19 = in_RDI[in_EDX * 0x1e];
  fVar40 = in_RDI[in_EDX * 0x1f];
  fVar1 = add_float(fVar2,fVar3);
  fVar2 = sub_float(fVar2,fVar3);
  fVar3 = add_float(fVar4,fVar5);
  fVar4 = sub_float(fVar4,fVar5);
  fVar5 = add_float(fVar1,fVar3);
  fVar3 = sub_float(fVar1,fVar3);
  fVar1 = add_float(fVar6,fVar7);
  fVar6 = sub_float(fVar6,fVar7);
  fVar7 = add_float(fVar8,fVar9);
  fVar8 = sub_float(fVar8,fVar9);
  fVar9 = add_float(fVar1,fVar7);
  fVar7 = sub_float(fVar1,fVar7);
  fVar1 = add_float(fVar5,fVar9);
  fVar5 = sub_float(fVar5,fVar9);
  fVar9 = sub_float(fVar6,fVar8);
  fVar9 = mul_float(0.707107,fVar9);
  fVar9 = add_float(fVar2,fVar9);
  fVar10 = sub_float(0.0,fVar4);
  fVar11 = add_float(fVar8,fVar6);
  fVar11 = mul_float(0.707107,fVar11);
  fVar10 = sub_float(fVar10,fVar11);
  fVar11 = sub_float(fVar6,fVar8);
  fVar11 = mul_float(0.707107,fVar11);
  fVar2 = sub_float(fVar2,fVar11);
  fVar6 = add_float(fVar8,fVar6);
  fVar6 = mul_float(0.707107,fVar6);
  fVar6 = sub_float(fVar4,fVar6);
  fVar4 = add_float(fVar12,fVar14);
  fVar12 = sub_float(fVar12,fVar14);
  fVar8 = add_float(fVar13,fVar18);
  fVar13 = sub_float(fVar13,fVar18);
  fVar14 = add_float(fVar4,fVar8);
  fVar4 = sub_float(fVar4,fVar8);
  fVar8 = add_float(fVar15,fVar16);
  fVar15 = sub_float(fVar15,fVar16);
  fVar16 = add_float(fVar17,fVar19);
  fVar17 = sub_float(fVar17,fVar19);
  fVar18 = add_float(fVar8,fVar16);
  fVar8 = sub_float(fVar8,fVar16);
  fVar16 = add_float(fVar14,fVar18);
  fVar14 = sub_float(fVar14,fVar18);
  fVar18 = sub_float(fVar15,fVar17);
  fVar18 = mul_float(0.707107,fVar18);
  fVar18 = add_float(fVar12,fVar18);
  fVar19 = sub_float(0.0,fVar13);
  fVar11 = add_float(fVar17,fVar15);
  fVar11 = mul_float(0.707107,fVar11);
  fVar19 = sub_float(fVar19,fVar11);
  fVar11 = sub_float(fVar15,fVar17);
  fVar11 = mul_float(0.707107,fVar11);
  fVar12 = sub_float(fVar12,fVar11);
  fVar15 = add_float(fVar17,fVar15);
  fVar15 = mul_float(0.707107,fVar15);
  fVar15 = sub_float(fVar13,fVar15);
  fVar13 = add_float(fVar1,fVar16);
  fVar17 = sub_float(fVar1,fVar16);
  fVar16 = mul_float(0.92388,fVar18);
  fVar1 = mul_float(0.382683,fVar19);
  fVar16 = add_float(fVar16,fVar1);
  fVar16 = add_float(fVar9,fVar16);
  fVar1 = mul_float(0.92388,fVar19);
  fVar11 = mul_float(0.382683,fVar18);
  fVar1 = sub_float(fVar1,fVar11);
  fVar1 = add_float(fVar10,fVar1);
  fVar11 = sub_float(fVar4,fVar8);
  fVar11 = mul_float(0.707107,fVar11);
  fVar11 = add_float(fVar3,fVar11);
  fVar20 = sub_float(0.0,fVar7);
  fVar21 = add_float(fVar8,fVar4);
  fVar21 = mul_float(0.707107,fVar21);
  fVar20 = sub_float(fVar20,fVar21);
  fVar21 = mul_float(0.382683,fVar12);
  fVar22 = mul_float(0.92388,fVar15);
  fVar21 = add_float(fVar21,fVar22);
  fVar21 = add_float(fVar2,fVar21);
  fVar22 = mul_float(0.382683,fVar15);
  fVar23 = mul_float(0.92388,fVar12);
  fVar22 = sub_float(fVar22,fVar23);
  fVar22 = add_float(fVar6,fVar22);
  fVar23 = mul_float(0.382683,fVar12);
  fVar23 = sub_float(0.0,fVar23);
  fVar24 = mul_float(0.92388,fVar15);
  fVar23 = sub_float(fVar23,fVar24);
  fVar2 = add_float(fVar2,fVar23);
  fVar6 = sub_float(0.0,fVar6);
  fVar12 = mul_float(0.92388,fVar12);
  fVar15 = mul_float(0.382683,fVar15);
  fVar12 = sub_float(fVar12,fVar15);
  fVar12 = sub_float(fVar6,fVar12);
  fVar6 = sub_float(fVar4,fVar8);
  fVar6 = mul_float(0.707107,fVar6);
  fVar6 = sub_float(fVar3,fVar6);
  fVar15 = add_float(fVar8,fVar4);
  fVar15 = mul_float(0.707107,fVar15);
  fVar15 = sub_float(fVar7,fVar15);
  fVar4 = mul_float(0.92388,fVar18);
  fVar4 = sub_float(0.0,fVar4);
  fVar8 = mul_float(0.382683,fVar19);
  fVar4 = sub_float(fVar4,fVar8);
  fVar4 = add_float(fVar9,fVar4);
  fVar8 = sub_float(0.0,fVar10);
  fVar3 = mul_float(0.382683,fVar18);
  fVar7 = mul_float(0.92388,fVar19);
  fVar3 = sub_float(fVar3,fVar7);
  fVar8 = sub_float(fVar8,fVar3);
  fVar3 = add_float(fVar25,fVar26);
  fVar25 = sub_float(fVar25,fVar26);
  fVar26 = add_float(fVar27,fVar31);
  fVar27 = sub_float(fVar27,fVar31);
  fVar7 = add_float(fVar3,fVar26);
  fVar3 = sub_float(fVar3,fVar26);
  fVar26 = add_float(fVar28,fVar29);
  fVar28 = sub_float(fVar28,fVar29);
  fVar29 = add_float(fVar30,fVar39);
  fVar30 = sub_float(fVar30,fVar39);
  fVar31 = add_float(fVar26,fVar29);
  fVar26 = sub_float(fVar26,fVar29);
  fVar29 = add_float(fVar7,fVar31);
  fVar7 = sub_float(fVar7,fVar31);
  fVar31 = sub_float(fVar28,fVar30);
  fVar31 = mul_float(0.707107,fVar31);
  fVar31 = add_float(fVar25,fVar31);
  fVar18 = sub_float(0.0,fVar27);
  fVar9 = add_float(fVar30,fVar28);
  fVar9 = mul_float(0.707107,fVar9);
  fVar18 = sub_float(fVar18,fVar9);
  fVar9 = sub_float(fVar28,fVar30);
  fVar9 = mul_float(0.707107,fVar9);
  fVar25 = sub_float(fVar25,fVar9);
  fVar28 = add_float(fVar30,fVar28);
  fVar28 = mul_float(0.707107,fVar28);
  fVar28 = sub_float(fVar27,fVar28);
  fVar27 = add_float(fVar32,fVar34);
  fVar32 = sub_float(fVar32,fVar34);
  fVar30 = add_float(fVar33,fVar38);
  fVar33 = sub_float(fVar33,fVar38);
  fVar34 = add_float(fVar27,fVar30);
  fVar27 = sub_float(fVar27,fVar30);
  fVar30 = add_float(fVar35,fVar36);
  fVar35 = sub_float(fVar35,fVar36);
  fVar36 = add_float(fVar37,fVar40);
  fVar37 = sub_float(fVar37,fVar40);
  fVar38 = add_float(fVar30,fVar36);
  fVar30 = sub_float(fVar30,fVar36);
  fVar36 = add_float(fVar34,fVar38);
  fVar34 = sub_float(fVar34,fVar38);
  fVar38 = sub_float(fVar35,fVar37);
  fVar38 = mul_float(0.707107,fVar38);
  fVar38 = add_float(fVar32,fVar38);
  fVar9 = sub_float(0.0,fVar33);
  fVar39 = add_float(fVar37,fVar35);
  fVar39 = mul_float(0.707107,fVar39);
  fVar9 = sub_float(fVar9,fVar39);
  fVar39 = sub_float(fVar35,fVar37);
  fVar39 = mul_float(0.707107,fVar39);
  fVar32 = sub_float(fVar32,fVar39);
  fVar35 = add_float(fVar37,fVar35);
  fVar35 = mul_float(0.707107,fVar35);
  fVar35 = sub_float(fVar33,fVar35);
  fVar33 = add_float(fVar29,fVar36);
  fVar37 = sub_float(fVar29,fVar36);
  fVar29 = mul_float(0.92388,fVar38);
  fVar36 = mul_float(0.382683,fVar9);
  fVar29 = add_float(fVar29,fVar36);
  fVar29 = add_float(fVar31,fVar29);
  fVar36 = mul_float(0.92388,fVar9);
  fVar39 = mul_float(0.382683,fVar38);
  fVar36 = sub_float(fVar36,fVar39);
  fVar36 = add_float(fVar18,fVar36);
  fVar39 = sub_float(fVar27,fVar30);
  fVar39 = mul_float(0.707107,fVar39);
  fVar39 = add_float(fVar3,fVar39);
  fVar19 = sub_float(0.0,fVar26);
  fVar40 = add_float(fVar30,fVar27);
  fVar40 = mul_float(0.707107,fVar40);
  fVar19 = sub_float(fVar19,fVar40);
  fVar40 = mul_float(0.382683,fVar32);
  fVar10 = mul_float(0.92388,fVar35);
  fVar40 = add_float(fVar40,fVar10);
  fVar40 = add_float(fVar25,fVar40);
  fVar10 = mul_float(0.382683,fVar35);
  fVar23 = mul_float(0.92388,fVar32);
  fVar10 = sub_float(fVar10,fVar23);
  fVar10 = add_float(fVar28,fVar10);
  fVar23 = mul_float(0.382683,fVar32);
  fVar23 = sub_float(0.0,fVar23);
  fVar24 = mul_float(0.92388,fVar35);
  fVar23 = sub_float(fVar23,fVar24);
  fVar25 = add_float(fVar25,fVar23);
  fVar28 = sub_float(0.0,fVar28);
  fVar32 = mul_float(0.92388,fVar32);
  fVar35 = mul_float(0.382683,fVar35);
  fVar32 = sub_float(fVar32,fVar35);
  fVar32 = sub_float(fVar28,fVar32);
  fVar28 = sub_float(fVar27,fVar30);
  fVar28 = mul_float(0.707107,fVar28);
  fVar28 = sub_float(fVar3,fVar28);
  fVar35 = add_float(fVar30,fVar27);
  fVar35 = mul_float(0.707107,fVar35);
  fVar35 = sub_float(fVar26,fVar35);
  fVar27 = mul_float(0.92388,fVar38);
  fVar27 = sub_float(0.0,fVar27);
  fVar30 = mul_float(0.382683,fVar9);
  fVar27 = sub_float(fVar27,fVar30);
  fVar27 = add_float(fVar31,fVar27);
  fVar30 = sub_float(0.0,fVar18);
  fVar3 = mul_float(0.382683,fVar38);
  fVar26 = mul_float(0.92388,fVar9);
  fVar3 = sub_float(fVar3,fVar26);
  fVar30 = sub_float(fVar30,fVar3);
  fVar3 = add_float(fVar13,fVar33);
  store_float(in_RSI,fVar3);
  fVar3 = mul_float(0.980785,fVar29);
  fVar26 = mul_float(0.19509,fVar36);
  fVar3 = add_float(fVar3,fVar26);
  fVar3 = add_float(fVar16,fVar3);
  store_float(in_RSI + in_EDX,fVar3);
  fVar3 = mul_float(0.92388,fVar39);
  fVar26 = mul_float(0.382683,fVar19);
  fVar3 = add_float(fVar3,fVar26);
  fVar3 = add_float(fVar11,fVar3);
  store_float(in_RSI + (in_EDX << 1),fVar3);
  fVar3 = mul_float(0.83147,fVar40);
  fVar26 = mul_float(0.55557,fVar10);
  fVar3 = add_float(fVar3,fVar26);
  fVar3 = add_float(fVar21,fVar3);
  store_float(in_RSI + in_EDX * 3,fVar3);
  fVar3 = sub_float(fVar7,fVar34);
  fVar3 = mul_float(0.707107,fVar3);
  fVar3 = add_float(fVar5,fVar3);
  store_float(in_RSI + (in_EDX << 2),fVar3);
  fVar3 = mul_float(0.55557,fVar25);
  fVar26 = mul_float(0.83147,fVar32);
  fVar3 = add_float(fVar3,fVar26);
  fVar3 = add_float(fVar2,fVar3);
  store_float(in_RSI + in_EDX * 5,fVar3);
  fVar3 = mul_float(0.382683,fVar28);
  fVar26 = mul_float(0.92388,fVar35);
  fVar3 = add_float(fVar3,fVar26);
  fVar3 = add_float(fVar6,fVar3);
  store_float(in_RSI + in_EDX * 6,fVar3);
  fVar3 = mul_float(0.19509,fVar27);
  fVar26 = mul_float(0.980785,fVar30);
  fVar3 = add_float(fVar3,fVar26);
  fVar3 = add_float(fVar4,fVar3);
  store_float(in_RSI + in_EDX * 7,fVar3);
  store_float(in_RSI + (in_EDX << 3),fVar17);
  fVar17 = mul_float(0.19509,fVar27);
  fVar17 = sub_float(0.0,fVar17);
  fVar3 = mul_float(0.980785,fVar30);
  fVar17 = sub_float(fVar17,fVar3);
  fVar4 = add_float(fVar4,fVar17);
  store_float(in_RSI + in_EDX * 9,fVar4);
  fVar4 = mul_float(0.382683,fVar28);
  fVar4 = sub_float(0.0,fVar4);
  fVar17 = mul_float(0.92388,fVar35);
  fVar4 = sub_float(fVar4,fVar17);
  fVar6 = add_float(fVar6,fVar4);
  store_float(in_RSI + in_EDX * 10,fVar6);
  fVar6 = mul_float(0.55557,fVar25);
  fVar6 = sub_float(0.0,fVar6);
  fVar4 = mul_float(0.83147,fVar32);
  fVar6 = sub_float(fVar6,fVar4);
  fVar2 = add_float(fVar2,fVar6);
  store_float(in_RSI + in_EDX * 0xb,fVar2);
  fVar2 = sub_float(fVar7,fVar34);
  fVar2 = mul_float(0.707107,fVar2);
  fVar2 = sub_float(fVar5,fVar2);
  store_float(in_RSI + in_EDX * 0xc,fVar2);
  fVar2 = mul_float(0.83147,fVar40);
  fVar2 = sub_float(0.0,fVar2);
  fVar6 = mul_float(0.55557,fVar10);
  fVar2 = sub_float(fVar2,fVar6);
  fVar2 = add_float(fVar21,fVar2);
  store_float(in_RSI + in_EDX * 0xd,fVar2);
  fVar2 = mul_float(0.92388,fVar39);
  fVar2 = sub_float(0.0,fVar2);
  fVar6 = mul_float(0.382683,fVar19);
  fVar2 = sub_float(fVar2,fVar6);
  fVar2 = add_float(fVar11,fVar2);
  store_float(in_RSI + in_EDX * 0xe,fVar2);
  fVar2 = mul_float(0.980785,fVar29);
  fVar2 = sub_float(0.0,fVar2);
  fVar6 = mul_float(0.19509,fVar36);
  fVar2 = sub_float(fVar2,fVar6);
  fVar2 = add_float(fVar16,fVar2);
  store_float(in_RSI + in_EDX * 0xf,fVar2);
  fVar2 = sub_float(fVar13,fVar33);
  store_float(in_RSI + (in_EDX << 4),fVar2);
  fVar2 = mul_float(0.980785,fVar36);
  fVar6 = mul_float(0.19509,fVar29);
  fVar2 = sub_float(fVar2,fVar6);
  fVar2 = add_float(fVar1,fVar2);
  store_float(in_RSI + in_EDX * 0x11,fVar2);
  fVar2 = mul_float(0.92388,fVar19);
  fVar6 = mul_float(0.382683,fVar39);
  fVar2 = sub_float(fVar2,fVar6);
  fVar2 = add_float(fVar20,fVar2);
  store_float(in_RSI + in_EDX * 0x12,fVar2);
  fVar2 = mul_float(0.83147,fVar10);
  fVar6 = mul_float(0.55557,fVar40);
  fVar2 = sub_float(fVar2,fVar6);
  fVar2 = add_float(fVar22,fVar2);
  store_float(in_RSI + in_EDX * 0x13,fVar2);
  fVar2 = sub_float(0.0,fVar14);
  fVar6 = add_float(fVar34,fVar7);
  fVar6 = mul_float(0.707107,fVar6);
  fVar2 = sub_float(fVar2,fVar6);
  store_float(in_RSI + in_EDX * 0x14,fVar2);
  fVar2 = mul_float(0.55557,fVar32);
  fVar6 = mul_float(0.83147,fVar25);
  fVar2 = sub_float(fVar2,fVar6);
  fVar2 = add_float(fVar12,fVar2);
  store_float(in_RSI + in_EDX * 0x15,fVar2);
  fVar2 = mul_float(0.382683,fVar35);
  fVar6 = mul_float(0.92388,fVar28);
  fVar2 = sub_float(fVar2,fVar6);
  fVar2 = add_float(fVar15,fVar2);
  store_float(in_RSI + in_EDX * 0x16,fVar2);
  fVar2 = mul_float(0.19509,fVar30);
  fVar6 = mul_float(0.980785,fVar27);
  fVar2 = sub_float(fVar2,fVar6);
  fVar2 = add_float(fVar8,fVar2);
  store_float(in_RSI + in_EDX * 0x17,fVar2);
  fVar2 = sub_float(0.0,fVar37);
  store_float(in_RSI + in_EDX * 0x18,fVar2);
  fVar2 = sub_float(0.0,fVar8);
  fVar6 = mul_float(0.980785,fVar27);
  fVar4 = mul_float(0.19509,fVar30);
  fVar6 = sub_float(fVar6,fVar4);
  fVar2 = sub_float(fVar2,fVar6);
  store_float(in_RSI + in_EDX * 0x19,fVar2);
  fVar2 = sub_float(0.0,fVar15);
  fVar6 = mul_float(0.92388,fVar28);
  fVar28 = mul_float(0.382683,fVar35);
  fVar6 = sub_float(fVar6,fVar28);
  fVar2 = sub_float(fVar2,fVar6);
  store_float(in_RSI + in_EDX * 0x1a,fVar2);
  fVar2 = sub_float(0.0,fVar12);
  fVar25 = mul_float(0.83147,fVar25);
  fVar12 = mul_float(0.55557,fVar32);
  fVar25 = sub_float(fVar25,fVar12);
  fVar2 = sub_float(fVar2,fVar25);
  store_float(in_RSI + in_EDX * 0x1b,fVar2);
  fVar2 = add_float(fVar34,fVar7);
  fVar2 = mul_float(0.707107,fVar2);
  fVar2 = sub_float(fVar14,fVar2);
  store_float(in_RSI + in_EDX * 0x1c,fVar2);
  fVar2 = sub_float(0.0,fVar22);
  fVar25 = mul_float(0.55557,fVar40);
  fVar12 = mul_float(0.83147,fVar10);
  fVar25 = sub_float(fVar25,fVar12);
  fVar2 = sub_float(fVar2,fVar25);
  store_float(in_RSI + in_EDX * 0x1d,fVar2);
  fVar2 = sub_float(0.0,fVar20);
  fVar25 = mul_float(0.382683,fVar39);
  fVar12 = mul_float(0.92388,fVar19);
  fVar25 = sub_float(fVar25,fVar12);
  fVar2 = sub_float(fVar2,fVar25);
  store_float(in_RSI + in_EDX * 0x1e,fVar2);
  fVar2 = sub_float(0.0,fVar1);
  fVar25 = mul_float(0.19509,fVar29);
  fVar12 = mul_float(0.980785,fVar36);
  fVar25 = sub_float(fVar25,fVar12);
  fVar2 = sub_float(fVar2,fVar25);
  store_float(in_RSI + in_EDX * 0x1f,fVar2);
  return;
}

Assistant:

void aom_fft2x2_float_c(const float *input, float *temp, float *output) {
  aom_fft_2d_gen(input, temp, output, 2, aom_fft1d_2_float, simple_transpose,
                 unpack_2d_output, 1);
}